

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

string * __thiscall
cmExtraCodeLiteGenerator::CollectSourceFiles
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *makefile,
          cmGeneratorTarget *gt,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles)

{
  cmSourceFile *this_00;
  pointer ppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  TargetType TVar4;
  FileFormat FVar5;
  string *psVar6;
  mapped_type *ppcVar7;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_78;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)otherFiles;
  TVar4 = cmGeneratorTarget::GetType(gt);
  if (TVar4 < OBJECT_LIBRARY) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)(&DAT_0053b8f8 + *(int *)(&DAT_0053b8f8 + (ulong)TVar4 * 4)));
  }
  TVar4 = cmGeneratorTarget::GetType(gt);
  if (TVar4 < OBJECT_LIBRARY) {
    local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_BUILD_TYPE","");
    psVar6 = cmMakefile::GetSafeDefinition(makefile,&local_50);
    cmGeneratorTarget::GetSourceFiles(gt,&local_78,psVar6);
    ppcVar1 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar2 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      ppcVar1 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      ppcVar2 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    }
    for (; ppcVar3 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
        ppcVar1 !=
        local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
      this_00 = *ppcVar1;
      local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar2;
      psVar6 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
      FVar5 = cmSystemTools::GetFileFormat(psVar6);
      if ((FVar5 < HEADER_FILE_FORMAT) && ((0x2eU >> (FVar5 & 0x1f) & 1) != 0)) {
        psVar6 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        ppcVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  ::operator[](cFiles,psVar6);
        *ppcVar7 = this_00;
      }
      else {
        psVar6 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_58,psVar6);
      }
      ppcVar2 = local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar3;
    }
    if (local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar2;
      operator_delete(local_78.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::CollectSourceFiles(
  const cmMakefile* makefile, const cmGeneratorTarget* gt,
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles)
{
  std::string projectType;
  switch (gt->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      projectType = "Executable";
    } break;
    case cmStateEnums::STATIC_LIBRARY: {
      projectType = "Static Library";
    } break;
    case cmStateEnums::SHARED_LIBRARY: {
      projectType = "Dynamic Library";
    } break;
    case cmStateEnums::MODULE_LIBRARY: {
      projectType = "Dynamic Library";
    } break;
    default: // intended fallthrough
      break;
  }

  switch (gt->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      std::vector<cmSourceFile*> sources;
      gt->GetSourceFiles(sources,
                         makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
      for (cmSourceFile* s : sources) {
        // check whether it is a source or a include file
        // then put it accordingly into one of the two containers
        switch (cmSystemTools::GetFileFormat(s->GetExtension())) {
          case cmSystemTools::C_FILE_FORMAT:
          case cmSystemTools::CXX_FILE_FORMAT:
          case cmSystemTools::CUDA_FILE_FORMAT:
          case cmSystemTools::FORTRAN_FILE_FORMAT: {
            cFiles[s->GetFullPath()] = s;
          } break;
          default: {
            otherFiles.insert(s->GetFullPath());
          }
        }
      }
    }
    default: // intended fallthrough
      break;
  }
  return projectType;
}